

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  Tour *pTVar1;
  uint uVar2;
  char **strings;
  char *filepath;
  char *__filename;
  int iVar3;
  int iVar4;
  SolveStatus SVar5;
  cJSON_bool cVar6;
  cJSON_bool cVar7;
  cJSON_bool cVar8;
  cJSON_bool cVar9;
  cJSON_bool cVar10;
  cJSON_bool cVar11;
  cJSON_bool cVar12;
  cJSON_bool cVar13;
  cJSON_bool cVar14;
  cJSON_bool cVar15;
  cJSON_bool cVar16;
  cJSON_bool cVar17;
  cJSON_bool cVar18;
  cJSON_bool cVar19;
  cJSON_bool cVar20;
  cJSON_bool cVar21;
  cJSON_bool cVar22;
  cJSON_bool cVar23;
  cJSON_bool cVar24;
  cJSON_bool cVar25;
  cJSON_bool cVar26;
  cJSON_bool cVar27;
  cJSON_bool cVar28;
  uint uVar29;
  uint uVar30;
  arg_dbl *paVar31;
  arg_int *paVar32;
  arg_lit *paVar33;
  arg_str *paVar34;
  arg_str *paVar35;
  arg_int *paVar36;
  arg_file *paVar37;
  arg_lit *paVar38;
  arg_lit *paVar39;
  arg_file *paVar40;
  arg_file *paVar41;
  arg_file *paVar42;
  arg_end *end;
  FILE *__stream;
  time_t tVar43;
  char *pcVar44;
  size_t sVar45;
  int64_t iVar46;
  time_t tVar47;
  int64_t iVar48;
  uint *puVar49;
  char *pcVar50;
  FILE *pFVar51;
  cJSON *object;
  cJSON *pcVar52;
  cJSON *pcVar53;
  char *pcVar54;
  int32_t *piVar55;
  cJSON *item;
  undefined4 uVar56;
  byte bVar57;
  char *pcVar58;
  undefined4 in_register_0000003c;
  ulong uVar59;
  int level;
  byte bVar60;
  long lVar61;
  bool bVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  undefined1 auVar67 [16];
  ulong uVar68;
  byte local_21d8;
  ulong local_21d0;
  SolveStatus local_21c8;
  byte local_21c0;
  int local_2198;
  int iStack_2194;
  int iStack_2190;
  int iStack_218c;
  SolveStatus local_2178;
  Solution local_2148;
  Instance instance;
  time_t local_20d8;
  time_t local_20d0;
  long local_20c8;
  TimeRepr local_20c0;
  void *argtable [13];
  SolverParams params;
  char timerepr_str [4096];
  
  pcVar54 = *argv;
  if (argc == 1) {
    print_brief_description((char *)CONCAT44(in_register_0000003c,argc));
    print_version();
    putchar(10);
    print_use_help_for_more_information(pcVar54);
    return 1;
  }
  pcVar58 = (char *)(ulong)(uint)argc;
  paVar31 = arg_dbl0("t","timelimit",(char *)0x0,
                     "define the maximum timelimit in seconds (default 10 minutes)");
  paVar32 = arg_int0("s","seed",(char *)0x0,
                     "define the random seed to use (default is 0, eg compute it from the current time)"
                    );
  paVar33 = arg_lit0("a","treat-sigterm-as-failure",
                     "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit with non zero exit status. The JSON report output file will not be generated"
                    );
  paVar34 = arg_strn("D","define","KEY=VALUE",0,argc + 2,"define parameters");
  paVar35 = arg_str0("S","solver","SOLVER","solver to use (default \"mip\")");
  paVar36 = arg_int0((char *)0x0,"loglvl",(char *)0x0,
                     "control the log level (0: fatal&warning logs, 1: info logs, 2: trace logs, 3: debug logs (only in debug builds)"
                    );
  paVar37 = arg_file0("l","log",(char *)0x0,
                      "specify an additional file where logs would be stored (default none)");
  paVar38 = arg_lit0((char *)0x0,"help","print this help and exit");
  paVar39 = arg_lit0((char *)0x0,"version","print version information and exit");
  paVar40 = arg_file1("i","instance",(char *)0x0,"input instance file");
  paVar41 = arg_file0((char *)0x0,"visualize",(char *)0x0,"tour visualization output file");
  paVar42 = arg_file0("w","write-report",(char *)0x0,"write a JSON report output file.");
  end = arg_end(0x10);
  argtable[0] = paVar38;
  argtable[1] = paVar39;
  argtable[2] = paVar36;
  argtable[3] = paVar37;
  argtable[4] = paVar33;
  argtable[5] = paVar31;
  argtable[6] = paVar32;
  argtable[7] = paVar34;
  argtable[8] = paVar40;
  argtable[9] = paVar41;
  argtable[10] = paVar42;
  argtable[0xb] = paVar35;
  argtable[0xc] = end;
  iVar3 = arg_nullcheck(argtable);
  if (iVar3 == 0) {
    *paVar31->dval = 600.0;
    *paVar32->ival = 0;
    *paVar35->sval = "mip";
    *paVar37->filename = (char *)0x0;
    *paVar41->filename = (char *)0x0;
    *paVar42->filename = (char *)0x0;
    *paVar36->ival = 0;
    iVar3 = arg_parse(argc,argv,argtable);
    if (paVar38->count < 1) {
      if (0 < iVar3) {
        arg_print_errors((FILE *)_stdout,end,pcVar54);
        print_use_help_for_more_information(pcVar54);
        uVar29 = 1;
        __stream = (FILE *)0x0;
        goto LAB_00102921;
      }
      if (paVar39->count < 1) {
        iVar3 = *paVar36->ival;
        iVar4 = 0x20;
        if (iVar3 != 1) {
          iVar4 = (uint)(iVar3 == 2) * 0x20 + -0x20;
        }
        level = 0x40;
        if (0 < iVar3) {
          level = iVar4;
        }
        log_set_level(level);
        if (paVar37->count < 1) {
          __stream = (FILE *)0x0;
        }
        else {
          __stream = fopen(*paVar37->filename,"w");
          if (__stream == (FILE *)0x0) {
            __stream = (FILE *)0x0;
            fprintf(_stderr,"%s: Failed to open for logging\n",*paVar37->filename);
          }
          else {
            log_add_fp((FILE *)__stream,level);
          }
        }
        iVar3 = paVar33->count;
        pcVar54 = *paVar40->filename;
        pcVar58 = *paVar35->sval;
        dVar64 = *paVar31->dval;
        local_21d0 = (ulong)(uint)*paVar32->ival;
        strings = paVar34->sval;
        uVar29 = paVar34->count;
        filepath = *paVar41->filename;
        __filename = *paVar42->filename;
        if (*paVar32->ival == 0) {
          tVar43 = time((time_t *)0x0);
          local_21d0 = tVar43 % 0x7fffffff;
        }
        parse(&instance,pcVar54);
        if ((((0 < instance.num_customers) && (0 < instance.num_vehicles)) &&
            (0.0 < instance.vehicle_cap)) && (instance.demands != (double *)0x0)) {
          lVar61 = 0;
          memset(&params,0,0x1008);
          if (0x100 < (int)uVar29) {
            fprintf(_stderr,"Too many parameters definitions, %d max, got %d instead",0x100,
                    (ulong)uVar29);
            fflush(_stderr);
            abort();
          }
          uVar59 = 0;
          if (0 < (int)uVar29) {
            uVar59 = (ulong)uVar29;
          }
          for (; uVar59 * 8 - lVar61 != 0; lVar61 = lVar61 + 8) {
            pcVar50 = *(char **)((long)strings + lVar61);
            pcVar44 = strchr(pcVar50,0x3d);
            if (pcVar44 == (char *)0x0) {
              sVar45 = strlen(pcVar50);
              pcVar44 = pcVar50 + sVar45;
            }
            else {
              *pcVar44 = '\0';
              pcVar44 = pcVar44 + 1;
            }
            *(char **)((long)&params.params[0].name + lVar61 * 2) = pcVar50;
            *(char **)((long)&params.params[0].value + lVar61 * 2) = pcVar44;
          }
          params.num_params = (int32_t)uVar59;
          solution_create(&local_2148,&instance);
          tVar43 = time((time_t *)0x0);
          iVar46 = os_get_usecs();
          pcVar50 = "mip";
          if (pcVar58 != (char *)0x0) {
            pcVar50 = pcVar58;
          }
          SVar5 = cptp_solve(&instance,pcVar50,&params,&local_2148,dVar64,(int32_t)local_21d0);
          tVar47 = time((time_t *)0x0);
          iVar48 = os_get_usecs();
          lVar61 = iVar48 - iVar46;
          bVar62 = SVar5 == SOLVE_STATUS_NULL;
          bVar60 = (byte)((SVar5 & SOLVE_STATUS_ABORTION_SIGTERM) >> 4) & 0 < iVar3;
          puts("\n\n###\n###\n###\n");
          pFVar51 = _stdout;
          local_20c0._0_8_ = tVar43;
          local_20c0._8_8_ = tVar47;
          local_20c0._16_8_ = lVar61;
          fprintf(_stdout,"%-16s %s\n","SOLVER:",pcVar58);
          fprintf(pFVar51,"%-16s %f\n",dVar64,"TIMELIM:");
          fprintf(pFVar51,"%-16s %d\n","SEED:",local_21d0);
          fprintf(pFVar51,"%-16s %s\n","INPUT:",pcVar54);
          fprintf(pFVar51,"%-16s %.17g\n",instance.vehicle_cap,"VEHICLE_CAP:");
          uVar59 = (ulong)SVar5;
          fprintf(pFVar51,"%-16s 0x%x\n","STATUS:");
          uVar56 = (undefined4)uVar59;
          if ((SVar5 & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL && !bVar62) {
            printf("%-16s [%.17g, %.17g]\n",local_2148.dual_bound,local_2148.primal_bound,"BOUNDS:")
            ;
            printf("%-16s %.17g\n",
                   (local_2148.primal_bound - local_2148.dual_bound) /
                   (ABS(local_2148.primal_bound) + 1e-10),"GAP");
            uVar56 = (undefined4)uVar59;
            if ((SVar5 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) != SOLVE_STATUS_NULL) {
              pTVar1 = &local_2148.tour;
              printf("%-16s ","TOUR:");
              uVar30 = 0;
              while( true ) {
                puVar49 = (uint *)tsucc(pTVar1,uVar30);
                uVar56 = (undefined4)uVar59;
                uVar2 = *puVar49;
                if (uVar2 == 0) break;
                printf("%d ",(ulong)uVar30);
                uVar30 = uVar2;
              }
              printf("%d",(ulong)uVar30);
              putchar(10);
              dVar65 = tour_eval(&instance,pTVar1);
              dVar66 = tour_demand(&instance,pTVar1);
              dVar63 = tour_profit(&instance,pTVar1);
              printf("%-16s %.17g\n",dVar65,"TOUR COST:");
              printf("%-16s %.17g\n",dVar63,"TOUR PROFIT:");
              printf("%-16s %.17g   (%.3g%%)\n",dVar66,(dVar66 / instance.vehicle_cap) * 100.0,
                     "TOUR DEMAND:");
            }
          }
          else {
            printf("%-16s Could not solve\n","ERR:");
          }
          pcVar50 = ctime((time_t *)&local_20c0);
          printf("%-16s %s","STARTED:",pcVar50);
          pcVar50 = ctime((time_t *)&local_20c0.minutes);
          printf("%-16s %s","ENDED:",pcVar50);
          printf("%-16s ","TOOK:");
          timerepr_from_usecs((TimeRepr *)timerepr_str,local_20c0._16_8_);
          print_timerepr((FILE *)_stdout,(TimeRepr *)timerepr_str);
          putchar(10);
          pcVar50 = "TRUE";
          if (bVar60 != 0 || ((SVar5 & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL || bVar62)) {
            pcVar50 = "FALSE";
          }
          printf("%-16s %s\n","SUCCESS",pcVar50);
          if (bVar60 == 0 && ((SVar5 & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL && !bVar62)) {
            local_20d8 = tVar43;
            local_20d0 = tVar47;
            local_20c8 = lVar61;
            if (__filename != (char *)0x0) {
              pFVar51 = fopen(__filename,"w");
              if (pFVar51 == (FILE *)0x0) {
                log_log(0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                        ,0x99,"%s: failed to open file for writing JSON report",__filename);
              }
              else {
                object = cJSON_CreateObject();
                if (object == (cJSON *)0x0) {
                  log_log(0x80,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                          ,0x9f,"%s :: Failed to create JSON root object","writeout_json_report");
                }
                else {
                  local_2178 = SVar5 & SOLVE_STATUS_ERR;
                  local_21c8 = SVar5 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL;
                  pcVar52 = cJSON_CreateString(pcVar58);
                  cVar6 = cJSON_AddItemToObject(object,"solverName",pcVar52);
                  pcVar52 = cJSON_CreateNumber(dVar64);
                  cVar7 = cJSON_AddItemToObject(object,"timeLimit",pcVar52);
                  pcVar52 = cJSON_CreateNumber((double)(int32_t)local_21d0);
                  cVar8 = cJSON_AddItemToObject(object,"randomSeed",pcVar52);
                  pcVar52 = cJSON_CreateStringArray(strings,uVar29);
                  cVar9 = cJSON_AddItemToObject(object,"cmdLineDefines",pcVar52);
                  pcVar52 = cJSON_CreateString(pcVar54);
                  cVar10 = cJSON_AddItemToObject(object,"inputFile",pcVar52);
                  pcVar52 = cJSON_CreateObject();
                  cVar11 = cJSON_AddItemToObject(object,"instanceInfo",pcVar52);
                  if (instance.name == (char *)0x0) {
                    instance.name = "";
                  }
                  pcVar53 = cJSON_CreateString(instance.name);
                  cVar12 = cJSON_AddItemToObject(pcVar52,"name",pcVar53);
                  if (instance.comment == (char *)0x0) {
                    instance.comment = "";
                  }
                  pcVar53 = cJSON_CreateString(instance.comment);
                  cVar13 = cJSON_AddItemToObject(pcVar52,"comment",pcVar53);
                  pcVar53 = cJSON_CreateNumber(instance.vehicle_cap);
                  cVar14 = cJSON_AddItemToObject(pcVar52,"vehicleCap",pcVar53);
                  pcVar53 = cJSON_CreateNumber((double)instance.num_customers);
                  cVar15 = cJSON_AddItemToObject(pcVar52,"numCustomers",pcVar53);
                  pcVar53 = cJSON_CreateNumber((double)instance.num_vehicles);
                  cVar16 = cJSON_AddItemToObject(pcVar52,"numVehicles",pcVar53);
                  pcVar52 = cJSON_CreateObject();
                  cVar17 = cJSON_AddItemToObject(object,"solveStatus",pcVar52);
                  pcVar53 = cJSON_CreateNumber((double)SVar5);
                  cVar18 = cJSON_AddItemToObject(pcVar52,"code",pcVar53);
                  pcVar53 = cJSON_CreateBool(local_2178);
                  cVar19 = cJSON_AddItemToObject(pcVar52,"erroredOut",pcVar53);
                  pcVar53 = cJSON_CreateBool(local_21c8 >> 2);
                  cVar20 = cJSON_AddItemToObject(pcVar52,"containsPrimalSolution",pcVar53);
                  pcVar53 = cJSON_CreateBool(SVar5 >> 1 & 1);
                  cVar21 = cJSON_AddItemToObject(pcVar52,"closedProblem",pcVar53);
                  pcVar53 = cJSON_CreateBool(SVar5 >> 3 & 1);
                  cVar22 = cJSON_AddItemToObject(pcVar52,"resExhaustionAbortion",pcVar53);
                  pcVar53 = cJSON_CreateBool(SVar5 >> 4 & 1);
                  cVar23 = cJSON_AddItemToObject(pcVar52,"sigTermAbortion",pcVar53);
                  pcVar52 = cJSON_CreateObject();
                  cVar24 = cJSON_AddItemToObject(object,"timingInfo",pcVar52);
                  lVar61 = local_20c8;
                  timerepr_from_usecs(&local_20c0,local_20c8);
                  timerepr_to_string(&local_20c0,timerepr_str,0x1000);
                  pcVar53 = cJSON_CreateNumber((double)lVar61 * 1e-06);
                  cVar25 = cJSON_AddItemToObject(pcVar52,"took",pcVar53);
                  pcVar53 = cJSON_CreateString(timerepr_str);
                  cVar26 = cJSON_AddItemToObject(pcVar52,"tookRepr",pcVar53);
                  pcVar54 = ctime(&local_20d8);
                  sVar45 = strlen(pcVar54);
                  pcVar54[sVar45 - 1] = '\0';
                  pcVar53 = cJSON_CreateString(pcVar54);
                  cVar27 = cJSON_AddItemToObject(pcVar52,"started",pcVar53);
                  pcVar54 = ctime(&local_20d0);
                  sVar45 = strlen(pcVar54);
                  pcVar54[sVar45 - 1] = '\0';
                  pcVar53 = cJSON_CreateString(pcVar54);
                  cVar28 = cJSON_AddItemToObject(pcVar52,"ended",pcVar53);
                  uVar59 = CONCAT44(cVar26,cVar25) & CONCAT44(cVar18,cVar17) &
                           CONCAT44(cVar22,cVar21) & CONCAT44(cVar14,cVar13);
                  uVar68 = CONCAT44(cVar28,cVar27) & CONCAT44(cVar20,cVar19) &
                           CONCAT44(cVar24,cVar23) & CONCAT44(cVar16,cVar15);
                  pcVar52 = cJSON_CreateObject();
                  cVar13 = cJSON_AddItemToObject(object,"bounds",pcVar52);
                  pcVar53 = cJSON_CreateNumber(local_2148.dual_bound);
                  cVar14 = cJSON_AddItemToObject(pcVar52,"dual",pcVar53);
                  pcVar53 = cJSON_CreateNumber(local_2148.primal_bound);
                  cVar15 = cJSON_AddItemToObject(pcVar52,"primal",pcVar53);
                  pcVar53 = cJSON_CreateNumber((local_2148.primal_bound - local_2148.dual_bound) /
                                               (ABS(local_2148.primal_bound) + 1e-10));
                  cVar16 = cJSON_AddItemToObject(pcVar52,"gap",pcVar53);
                  local_2198 = (int)uVar59;
                  iStack_2194 = (int)(uVar59 >> 0x20);
                  iStack_2190 = (int)uVar68;
                  iStack_218c = (int)(uVar68 >> 0x20);
                  auVar67._0_4_ = local_2198 << 0x1f;
                  auVar67._4_4_ = iStack_2194 << 0x1f;
                  auVar67._8_4_ = iStack_2190 << 0x1f;
                  auVar67._12_4_ = iStack_218c << 0x1f;
                  iVar3 = movmskps(uVar56,auVar67);
                  bVar57 = (byte)cVar14 & (byte)cVar13 & (byte)cVar15 &
                           (byte)cVar12 &
                           (byte)cVar11 & (byte)cVar10 & (byte)cVar9 & (byte)cVar7 & (byte)cVar6 &
                           (byte)cVar8 & iVar3 == 0xf & (byte)cVar16;
                  if (local_21c8 != SOLVE_STATUS_NULL) {
                    pcVar52 = cJSON_CreateObject();
                    cVar6 = cJSON_AddItemToObject(object,"tourInfo",pcVar52);
                    pTVar1 = &local_2148.tour;
                    dVar64 = tour_eval(&instance,pTVar1);
                    dVar65 = tour_profit(&instance,pTVar1);
                    dVar66 = tour_demand(&instance,pTVar1);
                    pcVar53 = cJSON_CreateNumber(dVar64);
                    cVar7 = cJSON_AddItemToObject(pcVar52,"cost",pcVar53);
                    pcVar53 = cJSON_CreateNumber(dVar65);
                    cVar8 = cJSON_AddItemToObject(pcVar52,"profit",pcVar53);
                    pcVar53 = cJSON_CreateNumber(dVar66);
                    cVar9 = cJSON_AddItemToObject(pcVar52,"demand",pcVar53);
                    pcVar53 = cJSON_CreateArray();
                    iVar3 = 0;
                    do {
                      piVar55 = tsucc(pTVar1,iVar3);
                      iVar4 = *piVar55;
                      item = cJSON_CreateNumber((double)iVar3);
                      cJSON_AddItemToArray(pcVar53,item);
                      iVar3 = iVar4;
                    } while (iVar4 != 0);
                    local_2198._0_1_ = (byte)cVar6;
                    local_21d8 = (byte)cVar7;
                    local_21c0 = (byte)cVar9;
                    cVar6 = cJSON_AddItemToObject(pcVar52,"route",pcVar53);
                    bVar57 = (byte)cVar6 &
                             (byte)cVar8 & local_21d8 & bVar57 & (byte)local_2198 & local_21c0;
                  }
                  pcVar52 = cJSON_CreateObject();
                  uVar29 = cJSON_AddItemToObject(object,"constants",pcVar52);
                  pcVar53 = cJSON_CreateNumber(1e-06);
                  uVar30 = cJSON_AddItemToObject(pcVar52,"COST_TOLERANCE",pcVar53);
                  if (((bVar57 == 0) || ((uVar29 & 1) == 0)) || ((uVar30 & 1) == 0)) {
                    log_log(0x80,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                            ,0x133,
                            "%s :: Failed to add all the necessary JSON elements to the parent JSON root object"
                            ,"writeout_json_report");
                  }
                  else {
                    pcVar54 = cJSON_Print(object);
                    fputs(pcVar54,pFVar51);
                    free(pcVar54);
                  }
                  cJSON_Delete(object);
                }
                fclose(pFVar51);
              }
            }
            if (filepath != (char *)0x0) {
              render_tour_image(filepath,&instance,&local_2148.tour,(char *)0x0);
            }
          }
          instance_destroy(&instance);
          solution_destroy(&local_2148);
          uVar29 = (byte)(bVar60 | (byte)SVar5 | bVar62) & 1;
          goto LAB_00102921;
        }
        fprintf(_stderr,"%s: Failed to parse file\n",pcVar54);
        goto LAB_00102801;
      }
      print_version();
    }
    else {
      print_brief_description(pcVar58);
      printf("Usage: %s",pcVar54);
      arg_print_syntax((FILE *)_stdout,argtable,"\n");
      arg_print_glossary((FILE *)_stdout,argtable,"  %-32s %s\n");
      cptp_print_list_of_solvers_and_params();
    }
    __stream = (FILE *)0x0;
    uVar29 = 0;
  }
  else {
    __stream = (FILE *)0x0;
    printf("%s: insufficient memory\n",pcVar54);
LAB_00102801:
    uVar29 = 1;
  }
LAB_00102921:
  arg_freetable(argtable,0xd);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return uVar29;
}

Assistant:

int main(int argc, char **argv) {
    const char *progname = argv[0];
    FILE *log_file_handle = NULL;

    if (argc == 1) {
        print_brief_description(progname);
        print_version();
        printf("\n");
        print_use_help_for_more_information(progname);
        return EXIT_FAILURE;
    }

    struct arg_dbl *timelimit = arg_dbl0(
        "t", "timelimit", NULL,
        "define the maximum timelimit in seconds (default 10 minutes)");
    struct arg_int *randomseed =
        arg_int0("s", "seed", NULL,
                 "define the random seed to use (default is 0, eg compute it "
                 "from the current time)");
    struct arg_lit *treat_sigterm_as_failure =
        arg_lit0("a", "treat-sigterm-as-failure",
                 "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit "
                 "with non zero exit status. The JSON report output file will "
                 "not be generated");
    struct arg_str *defines =
        arg_strn("D", "define", "KEY=VALUE", 0, argc + 2, "define parameters");
    struct arg_str *solver =
        arg_str0("S", "solver", "SOLVER", "solver to use (default \"mip\")");
    struct arg_int *loglvl =
        arg_int0(NULL, "loglvl", NULL,
                 "control the log level (0: fatal&warning logs, 1: info logs, "
                 "2: trace logs, 3: debug logs (only in debug builds)");
    struct arg_file *logfile =
        arg_file0("l", "log", NULL,
                  "specify an additional file where logs would be "
                  "stored (default none)");
    struct arg_lit *help = arg_lit0(NULL, "help", "print this help and exit");
    struct arg_lit *version =
        arg_lit0(NULL, "version", "print version information and exit");
    struct arg_file *instance =
        arg_file1("i", "instance", NULL, "input instance file");

    struct arg_file *vis_path =
        arg_file0(NULL, "visualize", NULL, "tour visualization output file");
    struct arg_file *json_report_path = arg_file0(
        "w", "write-report", NULL, "write a JSON report output file.");

    struct arg_end *end = arg_end(MAX_NUMBER_OF_ERRORS_TO_DISPLAY);

    void *argtable[] = {help,
                        version,
                        loglvl,
                        logfile,
                        treat_sigterm_as_failure,
                        timelimit,
                        randomseed,
                        defines,
                        instance,
                        vis_path,
                        json_report_path,
                        solver,
                        end};

    int exitcode = 0;

    /* verify the argtable[] entries were allocated successfully */
    if (arg_nullcheck(argtable) != 0) {
        printf("%s: insufficient memory\n", progname);
        exitcode = 1;
        goto exit;
    }

    // Default time limit
    timelimit->dval[0] = DEFAULT_TIME_LIMIT;
    // Default random seed
    randomseed->ival[0] = 0;
    // Default solver
    solver->sval[0] = "mip";
    // No logging file by default
    logfile->filename[0] = NULL;
    // No tour visualization file by default
    vis_path->filename[0] = NULL;
    // No JSON report output file by default
    json_report_path->filename[0] = NULL;
    // Contain only fatal&warning log messages by default
    loglvl->ival[0] = 0;

    {
        int nerrors = arg_parse(argc, argv, argtable);

        /* special case: '--help' takes precedence over error reporting */
        if (help->count > 0) {
            print_brief_description(progname);
            printf("Usage: %s", progname);
            arg_print_syntax(stdout, argtable, "\n");
            arg_print_glossary(stdout, argtable, "  %-32s %s\n");
            cptp_print_list_of_solvers_and_params();
            exitcode = 0;
            goto exit;
        }

        if (nerrors > 0) {
            arg_print_errors(stdout, end, progname);
            print_use_help_for_more_information(progname);
            exitcode = 1;
            goto exit;
        }
    }

    /* special case: '--version' takes precedence error reporting */
    if (version->count > 0) {
        print_version();
        exitcode = 0;
        goto exit;
    }

    int32_t iloglvl = LOG_WARN;
    if (loglvl->ival[0] <= 0) {
        iloglvl = LOG_WARN;
    } else if (loglvl->ival[0] == 1) {
        iloglvl = LOG_INFO;
    } else if (loglvl->ival[0] == 2) {
        iloglvl = LOG_TRACE;
    } else {
        iloglvl = LOG_DEBUG;
    }

    log_set_level(iloglvl);

    if (logfile->count > 0) {
        log_file_handle = fopen(logfile->filename[0], "w");
        if (log_file_handle) {
            log_add_fp(log_file_handle, iloglvl);
        } else {
            fprintf(stderr, "%s: Failed to open for logging\n",
                    logfile->filename[0]);
        }
    }

    AppCtx ctx = {.loglvl = iloglvl,
                  .instance_filepath = instance->filename[0],
                  .treat_sigterm_as_failure =
                      treat_sigterm_as_failure->count > 0,
                  .solver = solver->sval[0],
                  .timelimit = timelimit->dval[0],
                  .randomseed = randomseed->ival[0],
                  .defines = defines->sval,
                  .num_defines = defines->count,
                  .vis_path = vis_path->filename[0],
                  .json_report_path = json_report_path->filename[0]};

    if (ctx.randomseed == 0) {
        ctx.randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    exitcode = main2(&ctx);

exit:
    arg_freetable(argtable, ARRAY_LEN(argtable));

    if (log_file_handle) {
        fclose(log_file_handle);
        log_file_handle = NULL;
    }

    return exitcode;
}